

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_wrappers_cartesian.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  char *__assertion;
  CartesianCrd g1;
  Matrix<double,_3,_1,_0,_3,_1> v;
  
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 1.0;
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 3.0;
  g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 1.0
  ;
  g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 3.0
  ;
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 4.0
  ;
  touch(&v);
  if ((v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] !=
       0.0) || (NAN(v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[0]))) {
    __assertion = "g2.x() == 0e0";
    __line = 0x2c;
  }
  else if ((v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
            != -1.0) ||
          (NAN(v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1]))) {
    __assertion = "g2.y() == -1e0";
    __line = 0x2d;
  }
  else if ((v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
            != 2.0) ||
          (NAN(v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2]))) {
    __assertion = "g2.z() == 2e0";
    __line = 0x2e;
  }
  else {
    touch(&g1.mv);
    if ((g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
         [0] != 0.0) ||
       (NAN(g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0]))) {
      __assertion = "g1.x() == 0e0";
      __line = 0x35;
    }
    else if ((g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[1] != 3.0) ||
            (NAN(g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                 .array[1]))) {
      __assertion = "g1.y() == 3e0";
      __line = 0x36;
    }
    else {
      if ((g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] == 2.0) &&
         (!NAN(g1.mv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[2]))) {
        return 0;
      }
      __assertion = "g1.z() == 2e0";
      __line = 0x37;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/xanthospap[P]ggeodesy/test/unit_tests/type_wrappers_cartesian.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {

  Eigen::Matrix<double, 3, 1> v;
  v(0) = 1e0;
  v(1) = 2e0;
  v(2) = 3e0;

  /* contains its own vector, does not alter v */
  CartesianCrd g1(v);
  assert(g1.x() == 1e0);
  assert(g1.y() == 2e0);
  assert(g1.z() == 3e0);

  /* a view of v; will alter original vector v, but not g1 */
  CartesianCrdView g2(v);
  g2.y() -= 2e0;
  assert(g2.x() == 1e0);
  assert(g2.y() == 0e0);
  assert(g2.z() == 3e0);

  /* alter the instance g1; v and g2 should remain unchanged */
  g1.y() = 4e0;
  assert(g2.x() == 1e0);
  assert(g2.y() == 0e0);
  assert(g2.z() == 3e0);
  assert(v(0) == 1e0);
  assert(v(1) == 0e0);
  assert(v(2) == 3e0);

  /* alter the g2 instance via a function; should not change g1 */
  touch(g2);
  assert(g2.x() == 0e0);
  assert(g2.y() == -1e0);
  assert(g2.z() == 2e0);
  assert(g1.x() == 1e0);
  assert(g1.y() == 4e0);
  assert(g1.z() == 3e0);

  /* alter the g1 instance via a function */
  touch(CartesianCrdView(g1));
  assert(g1.x() == 0e0);
  assert(g1.y() == 3e0);
  assert(g1.z() == 2e0);

  return 0;
}